

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection::Connection
          (Connection *this,int client_socket,int forwarding_socket,sockaddr_in *serveraddr)

{
  size_type sVar1;
  uint uVar2;
  runtime_error *this_00;
  int *piVar3;
  socklen_t __len;
  sockaddr *__addr;
  int iVar4;
  vector<char,_std::allocator<char>_> *__x;
  allocator local_b1;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [39];
  allocator_type local_69;
  vector<char,_std::allocator<char>_> local_68;
  allocator_type local_49;
  vector<char,_std::allocator<char>_> local_48;
  sockaddr_in *local_20;
  sockaddr_in *serveraddr_local;
  int forwarding_socket_local;
  int client_socket_local;
  Connection *this_local;
  
  __len = (socklen_t)serveraddr;
  this->kMaxTimeout = 0x80;
  this->kBufSize = 0x1000;
  this->client_socket_ = client_socket;
  this->forwarding_socket_ = forwarding_socket;
  this->data_c_f_ = 0;
  this->data_f_c_ = 0;
  this->serveraddr_ = serveraddr;
  local_20 = serveraddr;
  serveraddr_local._0_4_ = forwarding_socket;
  serveraddr_local._4_4_ = client_socket;
  _forwarding_socket_local = this;
  std::vector<char,_std::allocator<char>_>::vector(&this->buf_cf_);
  std::vector<char,_std::allocator<char>_>::vector(&this->buf_fc_);
  this->connected = false;
  this->active_ = true;
  iVar4 = this->forwarding_socket_;
  uVar2 = fcntl(iVar4,3,0);
  fcntl(iVar4,4,(ulong)(uVar2 | 0x800));
  sVar1 = this->kBufSize;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_48,sVar1,&local_49);
  std::vector<char,_std::allocator<char>_>::operator=(&this->buf_cf_,&local_48);
  std::vector<char,_std::allocator<char>_>::~vector(&local_48);
  std::allocator<char>::~allocator(&local_49);
  sVar1 = this->kBufSize;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_68,sVar1,&local_69);
  __x = &local_68;
  std::vector<char,_std::allocator<char>_>::operator=(&this->buf_fc_,__x);
  iVar4 = (int)__x;
  std::vector<char,_std::allocator<char>_>::~vector(&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (this->forwarding_socket_ == -1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"socket: ",&local_b1);
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::operator+(local_90,(char *)local_b0);
    std::runtime_error::runtime_error(this_00,(string *)local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  connect(this,iVar4,__addr,__len);
  return;
}

Assistant:

Connection::Connection(int client_socket, int forwarding_socket, sockaddr_in *serveraddr) :
        connected(false),
        forwarding_socket_(forwarding_socket),
        serveraddr_(serveraddr),
        client_socket_(client_socket),
        kMaxTimeout(128),
        kBufSize(4096),
        data_c_f_(0),
        data_f_c_(0),
        active_(true) {
    fcntl(forwarding_socket_, F_SETFL, fcntl(forwarding_socket_, F_GETFL, 0) | O_NONBLOCK);
    buf_cf_ = std::vector<char>(kBufSize);
    buf_fc_ = std::vector<char>(kBufSize);
    if (forwarding_socket_ == -1) {
        throw std::runtime_error(std::string("socket: ") + strerror(errno));
    }
    connect();
}